

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maxplus.cpp
# Opt level: O2

Factor * __thiscall libDAI::MaxPlus::beliefV(Factor *__return_storage_ptr__,MaxPlus *this,size_t i)

{
  int iVar1;
  undefined4 extraout_var;
  long lVar2;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  Var *n;
  long *plVar3;
  Prob prod;
  _Vector_base<double,_std::allocator<double>_> _Stack_68;
  VarSet local_50;
  
  iVar1 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[4])(this);
  lVar2 = (**(code **)(*(long *)CONCAT44(extraout_var,iVar1) + 0x30))
                    ((long *)CONCAT44(extraout_var,iVar1),i);
  TProb<double>::TProb((TProb<double> *)&_Stack_68,*(size_t *)(lVar2 + 8));
  iVar1 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[4])(this);
  plVar3 = *(long **)(*(long *)(CONCAT44(extraout_var_00,iVar1) + 0x70) + i * 0x18);
  while( true ) {
    iVar1 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[4])(this);
    if (plVar3 == *(long **)(*(long *)(CONCAT44(extraout_var_01,iVar1) + 0x70) + 8 + i * 0x18))
    break;
    TProb<double>::operator*=
              ((TProb<double> *)&_Stack_68,
               (this->_newmessages).
               super__Vector_base<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>.
               _M_impl.super__Vector_impl_data._M_start +
               *(long *)(*(long *)&(this->_g->_fg)._E12ind.
                                   super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start[i].
                                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                   ._M_impl.super__Vector_impl_data + *plVar3 * 8));
    plVar3 = plVar3 + 1;
  }
  TProb<double>::normalize((TProb<double> *)&_Stack_68,NORMPROB);
  iVar1 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[4])(this);
  n = (Var *)(**(code **)(*(long *)CONCAT44(extraout_var_02,iVar1) + 0x30))
                       ((long *)CONCAT44(extraout_var_02,iVar1),i);
  VarSet::VarSet(&local_50,n);
  TFactor<double>::TFactor(__return_storage_ptr__,&local_50,(TProb<double> *)&_Stack_68);
  std::_Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>::~_Vector_base
            ((_Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_> *)&local_50);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&_Stack_68);
  return __return_storage_ptr__;
}

Assistant:

Factor MaxPlus::beliefV( size_t i ) const {
        Prob prod( grm().var(i).states() ); 
        for( FactorGraph::nb_cit I = grm().nbV(i).begin(); I != grm().nbV(i).end(); I++ ) 
            prod *= newMessage(i,*I);

        prod.normalize();
        return( Factor( grm().var(i), prod ) );
    }